

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  ulong uVar1;
  long lVar2;
  string *port;
  ostream *poVar3;
  ostream *poVar4;
  UnitTestImpl *in_RDI;
  size_t pos;
  string *target;
  TestEventListener *in_stack_ffffffffffffff58;
  TestEventListeners *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar5;
  string local_68 [48];
  string local_38 [4];
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  GTestLogSeverity in_stack_ffffffffffffffdc;
  GTestLog *in_stack_ffffffffffffffe0;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    lVar2 = std::__cxx11::string::find(-0x38,0x3a);
    if (lVar2 == -1) {
      GTestLog::GTestLog(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      poVar3 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffff90);
      poVar3 = std::operator<<(poVar3,"unrecognized streaming target \"");
      poVar4 = std::operator<<(poVar3,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
      std::operator<<(poVar4,"\" ignored.");
      GTestLog::~GTestLog((GTestLog *)poVar3);
    }
    else {
      listeners(in_RDI);
      port = (string *)operator_new(0x10);
      uVar5 = 1;
      std::__cxx11::string::substr((ulong)local_38,0x250ac8);
      std::__cxx11::string::substr((ulong)local_68,0x250ac8);
      StreamingListener::StreamingListener
                ((StreamingListener *)CONCAT17(uVar5,in_stack_ffffffffffffff90),(string *)in_RDI,
                 port);
      TestEventListeners::Append(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_38);
    }
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      GTEST_LOG_(WARNING) << "unrecognized streaming target \"" << target
                          << "\" ignored.";
    }
  }
}